

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::Approx::toString_abi_cxx11_(string *__return_storage_ptr__,Approx *this)

{
  ReusableStringStream *pRVar1;
  string local_60;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  Approx *this_local;
  
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  pRVar1 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)local_30,(char (*) [9])"Approx( ");
  stringify<double>(&local_60,&this->m_value);
  pRVar1 = ReusableStringStream::operator<<
                     (pRVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_60);
  ReusableStringStream::operator<<(pRVar1,(char (*) [3])" )");
  std::__cxx11::string::~string((string *)&local_60);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }